

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperEQ<float,pbrt::AtomicFloat>
          (char *expected_expression,char *actual_expression,float *expected,AtomicFloat *actual)

{
  float fVar1;
  string *in_RCX;
  string *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  char *in_RSI;
  AtomicFloat *in_RDI;
  undefined8 in_R8;
  float fVar3;
  AssertionResult AVar4;
  AtomicFloat *value;
  string local_68 [32];
  string local_48 [39];
  undefined1 ignoring_case;
  string *expected_value;
  AtomicFloat *expected_expression_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  ignoring_case = (undefined1)((ulong)in_R8 >> 0x38);
  fVar1 = *(float *)in_RCX;
  value = in_RDI;
  expected_expression_00 = in_RDI;
  fVar3 = pbrt::AtomicFloat::operator_cast_to_float((AtomicFloat *)0x5b685f);
  if ((fVar1 != fVar3) || (NAN(fVar1) || NAN(fVar3))) {
    expected_value = in_RDX;
    FormatForComparisonFailureMessage<float,pbrt::AtomicFloat>((float *)value,(AtomicFloat *)in_RDX)
    ;
    FormatForComparisonFailureMessage<pbrt::AtomicFloat,float>(value,(float *)in_RDX);
    EqFailure((char *)expected_expression_00,in_RSI,expected_value,in_RCX,(bool)ignoring_case);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
    sVar2.ptr_ = extraout_RDX;
  }
  else {
    AVar4 = AssertionSuccess();
    sVar2 = AVar4.message_.ptr_;
  }
  AVar4.message_.ptr_ = sVar2.ptr_;
  AVar4._0_8_ = in_RDI;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}